

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTokenizer.cpp
# Opt level: O2

void __thiscall SimpleStringTokenizer::SkipTillToken(SimpleStringTokenizer *this)

{
  Byte BVar1;
  bool bVar2;
  int iVar3;
  EStatusCode EVar4;
  SimpleStringTokenizer *this_00;
  Byte buffer;
  Byte local_19;
  
  local_19 = '\0';
  if (this->mStream != (IByteReader *)0x0) {
    do {
      iVar3 = (*this->mStream->_vptr_IByteReader[3])();
      if ((char)iVar3 == '\0') {
        return;
      }
      this_00 = this;
      EVar4 = GetNextByteForToken(this,&local_19);
      BVar1 = local_19;
      if (EVar4 != eSuccess) {
        return;
      }
      bVar2 = IsPDFWhiteSpace(this_00,local_19);
    } while (bVar2);
    this->mHasTokenBuffer = true;
    this->mTokenBuffer = BVar1;
    this->mStreamPositionTracker = this->mStreamPositionTracker + -1;
  }
  return;
}

Assistant:

void SimpleStringTokenizer::SkipTillToken()
{
	Byte buffer = 0;

	if(!mStream)
		return;

	// skip till hitting first non space, or segment end
	while(mStream->NotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPDFWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}